

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O3

void ylt::metric::detail::stat_cpu(void)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  string *psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  rusage usage;
  timeval now;
  rusage local_c0;
  timeval local_30;
  
  if ((stat_cpu()::process_cpu_usage == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage), iVar2 != 0)) {
    psVar5 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    local_c0.ru_utime.tv_sec = (__time_t)&local_c0.ru_stime;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ylt_process_cpu_usage","");
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&stat_cpu::process_cpu_usage,
               psVar5);
    if ((timeval *)local_c0.ru_utime.tv_sec != &local_c0.ru_stime) {
      operator_delete((void *)local_c0.ru_utime.tv_sec,local_c0.ru_stime.tv_sec + 1);
    }
    __cxa_atexit(std::
                 __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&stat_cpu::process_cpu_usage,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage);
  }
  if ((stat_cpu()::process_cpu_usage_system == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage_system), iVar2 != 0)) {
    psVar5 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    local_c0.ru_utime.tv_sec = (__time_t)&local_c0.ru_stime;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"ylt_process_cpu_usage_system","");
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
               &stat_cpu::process_cpu_usage_system,psVar5);
    if ((timeval *)local_c0.ru_utime.tv_sec != &local_c0.ru_stime) {
      operator_delete((void *)local_c0.ru_utime.tv_sec,local_c0.ru_stime.tv_sec + 1);
    }
    __cxa_atexit(std::
                 __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&stat_cpu::process_cpu_usage_system,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage_system);
  }
  if ((stat_cpu()::process_cpu_usage_user == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage_user), iVar2 != 0)) {
    psVar5 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    local_c0.ru_utime.tv_sec = (__time_t)&local_c0.ru_stime;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"ylt_process_cpu_usage_user","");
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
               &stat_cpu::process_cpu_usage_user,psVar5);
    if ((timeval *)local_c0.ru_utime.tv_sec != &local_c0.ru_stime) {
      operator_delete((void *)local_c0.ru_utime.tv_sec,local_c0.ru_stime.tv_sec + 1);
    }
    __cxa_atexit(std::
                 __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&stat_cpu::process_cpu_usage_user,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage_user);
  }
  memset(&local_c0,0,0x90);
  getrusage(RUSAGE_SELF,&local_c0);
  lVar8 = local_c0.ru_utime.tv_sec * 1000000 + local_c0.ru_utime.tv_usec;
  lVar9 = local_c0.ru_stime.tv_sec * 1000000 + local_c0.ru_stime.tv_usec;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  peVar1 = stat_cpu::process_cpu_usage.
           super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar7 = local_30.tv_sec * 1000000 + local_30.tv_usec;
  lVar3 = lVar7;
  lVar4 = lVar9;
  lVar6 = lVar8;
  if ((last_time_us != 0) &&
     (lVar3 = last_time_us, lVar4 = last_sys_time_us, lVar6 = last_user_time_us,
     lVar7 - last_time_us != 0)) {
    lVar6 = ((lVar9 + lVar8) - last_sys_time_us) - last_user_time_us;
    dVar10 = (double)(lVar7 - last_time_us);
    lVar3 = lVar9 - last_sys_time_us;
    lVar4 = lVar8 - last_user_time_us;
    if (((stat_cpu::process_cpu_usage.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
      ((stat_cpu::process_cpu_usage.
        super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_basic_static_counter<long>).has_change_ = true;
    }
    thread_local_value<long>::update
              (&(peVar1->super_basic_static_counter<long>).default_label_value_,
               (long)((double)lVar6 / dVar10));
    peVar1 = stat_cpu::process_cpu_usage_system.
             super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((stat_cpu::process_cpu_usage_system.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
      ((stat_cpu::process_cpu_usage_system.
        super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_basic_static_counter<long>).has_change_ = true;
    }
    thread_local_value<long>::update
              (&(peVar1->super_basic_static_counter<long>).default_label_value_,
               (long)((double)lVar3 / dVar10));
    peVar1 = stat_cpu::process_cpu_usage_user.
             super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((stat_cpu::process_cpu_usage_user.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
      ((stat_cpu::process_cpu_usage_user.
        super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_basic_static_counter<long>).has_change_ = true;
    }
    thread_local_value<long>::update
              (&(peVar1->super_basic_static_counter<long>).default_label_value_,
               (long)((double)lVar4 / dVar10));
    lVar3 = lVar7;
    lVar4 = lVar9;
    lVar6 = lVar8;
  }
  last_user_time_us = lVar6;
  last_sys_time_us = lVar4;
  last_time_us = lVar3;
  return;
}

Assistant:

inline void stat_cpu() {
  static auto process_cpu_usage =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage");
  static auto process_cpu_usage_system =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage_system");
  static auto process_cpu_usage_user =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage_user");

  rusage usage{};
  getrusage(RUSAGE_SELF, &usage);
  int64_t utime = timeval_to_microseconds(usage.ru_utime);
  int64_t stime = timeval_to_microseconds(usage.ru_stime);
  int64_t time_total = utime + stime;
  int64_t now = gettimeofday_us();
  if (last_time_us == 0) {
    last_time_us = now;
    last_sys_time_us = stime;
    last_user_time_us = utime;
    return;
  }

  int64_t elapsed = now - last_time_us;
  if (elapsed == 0) {
    return;
  }

  double cpu_usage =
      double(time_total - (last_sys_time_us + last_user_time_us)) /
      (now - last_time_us);
  double sys_cpu_usage =
      double(stime - last_sys_time_us) / (now - last_time_us);
  double usr_cpu_usage =
      double(utime - last_user_time_us) / (now - last_time_us);
  process_cpu_usage->update(cpu_usage);
  process_cpu_usage_system->update(sys_cpu_usage);
  process_cpu_usage_user->update(usr_cpu_usage);

  last_time_us = now;
  last_sys_time_us = stime;
  last_user_time_us = utime;
}